

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

RealType __thiscall
OpenMD::SelectionEvaluator::getCharge(SelectionEvaluator *this,Atom *atom,int frame)

{
  AtomType *pAVar1;
  bool bVar2;
  RealType RVar3;
  RealType RVar4;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter local_28;
  FluctuatingChargeAdapter local_20;
  
  pAVar1 = atom->atomType_;
  local_28.at_ = pAVar1;
  bVar2 = FixedChargeAdapter::isFixedCharge(&local_28);
  RVar3 = 0.0;
  if (bVar2) {
    RVar3 = FixedChargeAdapter::getCharge(&local_28);
  }
  local_20.at_ = pAVar1;
  bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_20);
  if (bVar2) {
    RVar4 = StuntDouble::getFlucQPos(&atom->super_StuntDouble,frame);
    RVar3 = RVar3 + RVar4;
  }
  return RVar3;
}

Assistant:

RealType SelectionEvaluator::getCharge(Atom* atom, int frame) {
    RealType charge    = 0.0;
    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(frame); }
    return charge;
  }